

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O2

bool __thiscall xsettingsd::SettingsManager::LoadConfig(SettingsManager *this)

{
  pointer pcVar1;
  undefined8 uVar2;
  FILE *__stream;
  bool bVar3;
  FileCharStream *this_00;
  char *pcVar4;
  SettingsMap new_settings;
  ConfigParser parser;
  string local_48;
  
  this_00 = (FileCharStream *)operator_new(0x40);
  ConfigParser::FileCharStream::FileCharStream(this_00,&this->config_filename_);
  ConfigParser::ConfigParser(&parser,(CharStream *)this_00);
  new_settings.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &new_settings.map_._M_t._M_impl.super__Rb_tree_header._M_header;
  new_settings.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  new_settings.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  new_settings.map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  new_settings.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       new_settings.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = ConfigParser::Parse(&parser,&new_settings,&this->settings_,this->serial_ + 1);
  __stream = _stderr;
  uVar2 = kProgName;
  if (bVar3) {
    this->serial_ = this->serial_ + 1;
    pcVar4 = "s";
    if (new_settings.map_._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
      pcVar4 = "";
    }
    fprintf(_stderr,"%s: Loaded %zu setting%s from %s\n",kProgName,
            new_settings.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,pcVar4,
            (this->config_filename_)._M_dataplus._M_p);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>_>
    ::swap((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>_>
            *)&this->settings_,
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xsettingsd::Setting_*>_>_>
            *)&new_settings);
  }
  else {
    pcVar1 = (this->config_filename_)._M_dataplus._M_p;
    ConfigParser::FormatError_abi_cxx11_(&local_48,&parser);
    fprintf(__stream,"%s: Unable to parse %s: %s\n",uVar2,pcVar1,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
  }
  SettingsMap::~SettingsMap(&new_settings);
  ConfigParser::~ConfigParser(&parser);
  return bVar3;
}

Assistant:

bool SettingsManager::LoadConfig() {
  ConfigParser parser(new ConfigParser::FileCharStream(config_filename_));
  SettingsMap new_settings;
  if (!parser.Parse(&new_settings, &settings_, serial_ + 1)) {
    fprintf(stderr, "%s: Unable to parse %s: %s\n",
            kProgName, config_filename_.c_str(), parser.FormatError().c_str());
    return false;
  }
  serial_++;
  fprintf(stderr, "%s: Loaded %zu setting%s from %s\n",
          kProgName, new_settings.map().size(),
          (new_settings.map().size() == 1) ? "" : "s",
          config_filename_.c_str());
  settings_.swap(&new_settings);
  return true;
}